

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O2

void re2::SearchOnePass(int iters,char *regexp,StringPiece *text,Anchor anchor,bool expect_match)

{
  Regexp *this;
  Prog *this_00;
  bool bVar1;
  undefined1 local_1b0 [384];
  
  if (iters < 1) {
    iters = 0;
  }
  while (bVar1 = iters != 0, iters = iters + -1, bVar1) {
    StringPiece::StringPiece((StringPiece *)local_1b0,regexp);
    this = Regexp::Parse((StringPiece *)local_1b0,LikePerl,(RegexpStatus *)0x0);
    if (this == (Regexp *)0x0) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                 ,0x38e);
      std::operator<<((ostream *)(local_1b0 + 8),"Check failed: re");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1b0);
    }
    this_00 = Regexp::CompileToProg(this,0);
    if (this_00 == (Prog *)0x0) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                 ,0x390);
      std::operator<<((ostream *)(local_1b0 + 8),"Check failed: prog");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1b0);
    }
    bVar1 = Prog::IsOnePass(this_00);
    if (!bVar1) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                 ,0x391);
      std::operator<<((ostream *)(local_1b0 + 8),"Check failed: prog->IsOnePass()");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1b0);
    }
    bVar1 = Prog::SearchOnePass(this_00,text,text,anchor,kFirstMatch,(StringPiece *)0x0,0);
    if (bVar1 != expect_match) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                 ,0x393);
      std::operator<<((ostream *)(local_1b0 + 8),
                      "Check failed: (prog->SearchOnePass(text, text, anchor, Prog::kFirstMatch, __null, 0)) == (expect_match)"
                     );
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1b0);
    }
    Prog::~Prog(this_00);
    operator_delete(this_00);
    Regexp::Decref(this);
  }
  return;
}

Assistant:

void SearchOnePass(int iters, const char* regexp, const StringPiece& text,
            Prog::Anchor anchor, bool expect_match) {
  for (int i = 0; i < iters; i++) {
    Regexp* re = Regexp::Parse(regexp, Regexp::LikePerl, NULL);
    CHECK(re);
    Prog* prog = re->CompileToProg(0);
    CHECK(prog);
    CHECK(prog->IsOnePass());
    CHECK_EQ(prog->SearchOnePass(text, text, anchor, Prog::kFirstMatch, NULL, 0),
             expect_match);
    delete prog;
    re->Decref();
  }
}